

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy_generic.cpp
# Opt level: O0

QList<QNetworkProxy> * QNetworkProxyFactory::systemProxyForQuery(QNetworkProxyQuery *query)

{
  bool bVar1;
  QueryType QVar2;
  int iVar3;
  undefined8 in_RSI;
  QList<QNetworkProxy> *in_RDI;
  long in_FS_OFFSET;
  QNetworkProxy proxy_2;
  QNetworkProxy proxy_1;
  QNetworkProxy proxy;
  QString scheme;
  QUrl url;
  QByteArray proxy_env;
  QString queryProtocol;
  QList<QNetworkProxy> proxyList;
  undefined2 in_stack_fffffffffffffc88;
  undefined2 in_stack_fffffffffffffc8a;
  Capability in_stack_fffffffffffffc8c;
  byte in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc91;
  undefined2 in_stack_fffffffffffffc92;
  undefined4 in_stack_fffffffffffffc94;
  undefined2 in_stack_fffffffffffffc98;
  undefined2 in_stack_fffffffffffffc9a;
  QFlagsStorage<QNetworkProxy::Capability> in_stack_fffffffffffffc9c;
  QList<QNetworkProxy> *pQVar4;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  ProxyType type;
  QList<QNetworkProxy> *this;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [24];
  undefined8 local_288;
  QLatin1StringView local_280;
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  undefined1 local_228 [24];
  undefined8 local_210;
  QLatin1StringView local_208;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [24];
  undefined8 local_198;
  QLatin1StringView local_190;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined1 local_168 [24];
  QUrl local_150;
  char local_148 [24];
  char local_130 [24];
  char local_118 [24];
  QLatin1StringView local_100;
  char local_f0 [24];
  QLatin1StringView local_d8;
  char local_c8 [24];
  QLatin1StringView local_b0;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  type = (ProxyType)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  this = in_RDI;
  QList<QNetworkProxy>::QList((QList<QNetworkProxy> *)0x36d3bd);
  bVar1 = ignoreProxyFor((QNetworkProxyQuery *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  if (bVar1) {
    QString::QString((QString *)0x36d3dd);
    QString::QString((QString *)0x36d3ea);
    QString::QString((QString *)0x36d3f7);
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)this,type,
               (QString *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (quint16)((ulong)pQVar4 >> 0x30),(QString *)in_RDI,
               (QString *)
               CONCAT44(in_stack_fffffffffffffc9c.i,
                        CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
    QList<QNetworkProxy>::operator<<
              ((QList<QNetworkProxy> *)
               CONCAT44(in_stack_fffffffffffffc94,
                        CONCAT22(in_stack_fffffffffffffc92,
                                 CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
               (rvalue_ref)
               CONCAT44(in_stack_fffffffffffffc8c,
                        CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
    QList<QNetworkProxy>::QList
              ((QList<QNetworkProxy> *)
               CONCAT44(in_stack_fffffffffffffc94,
                        CONCAT22(in_stack_fffffffffffffc92,
                                 CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
               (QList<QNetworkProxy> *)
               CONCAT44(in_stack_fffffffffffffc8c,
                        CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x36d452);
    QString::~QString((QString *)0x36d45f);
    QString::~QString((QString *)0x36d46c);
    QString::~QString((QString *)0x36d479);
    goto LAB_0036ddad;
  }
  local_88 = 0xaaaaaaaaaaaaaaaa;
  local_80 = 0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  QNetworkProxyQuery::protocolTag
            ((QNetworkProxyQuery *)
             CONCAT44(in_stack_fffffffffffffc9c.i,
                      CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
  local_a0 = 0xaaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaaaaaaaaaa;
  local_90 = 0xaaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x36d4ff);
  local_b0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffc9c.i,
                                         CONCAT22(in_stack_fffffffffffffc9a,
                                                  in_stack_fffffffffffffc98)),
                        CONCAT44(in_stack_fffffffffffffc94,
                                 CONCAT22(in_stack_fffffffffffffc92,
                                          CONCAT11(in_stack_fffffffffffffc91,
                                                   in_stack_fffffffffffffc90))));
  bVar1 = ::operator==((QString *)
                       CONCAT44(in_stack_fffffffffffffc9c.i,
                                CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffc94,
                                CONCAT22(in_stack_fffffffffffffc92,
                                         CONCAT11(in_stack_fffffffffffffc91,
                                                  in_stack_fffffffffffffc90))));
  if (bVar1) {
    qgetenv(local_c8);
    QByteArray::operator=
              ((QByteArray *)
               CONCAT44(in_stack_fffffffffffffc94,
                        CONCAT22(in_stack_fffffffffffffc92,
                                 CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
               (QByteArray *)
               CONCAT44(in_stack_fffffffffffffc8c,
                        CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
    QByteArray::~QByteArray((QByteArray *)0x36d571);
  }
  else {
    local_d8 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffffc9c.i,
                                           CONCAT22(in_stack_fffffffffffffc9a,
                                                    in_stack_fffffffffffffc98)),
                          CONCAT44(in_stack_fffffffffffffc94,
                                   CONCAT22(in_stack_fffffffffffffc92,
                                            CONCAT11(in_stack_fffffffffffffc91,
                                                     in_stack_fffffffffffffc90))));
    bVar1 = ::operator==((QString *)
                         CONCAT44(in_stack_fffffffffffffc9c.i,
                                  CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)),
                         (QLatin1StringView *)
                         CONCAT44(in_stack_fffffffffffffc94,
                                  CONCAT22(in_stack_fffffffffffffc92,
                                           CONCAT11(in_stack_fffffffffffffc91,
                                                    in_stack_fffffffffffffc90))));
    if (bVar1) {
      qgetenv(local_f0);
      QByteArray::operator=
                ((QByteArray *)
                 CONCAT44(in_stack_fffffffffffffc94,
                          CONCAT22(in_stack_fffffffffffffc92,
                                   CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
                 (QByteArray *)
                 CONCAT44(in_stack_fffffffffffffc8c,
                          CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
      QByteArray::~QByteArray((QByteArray *)0x36d5e8);
    }
    else {
      local_100 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffc9c.i,
                                              CONCAT22(in_stack_fffffffffffffc9a,
                                                       in_stack_fffffffffffffc98)),
                             CONCAT44(in_stack_fffffffffffffc94,
                                      CONCAT22(in_stack_fffffffffffffc92,
                                               CONCAT11(in_stack_fffffffffffffc91,
                                                        in_stack_fffffffffffffc90))));
      bVar1 = ::operator==((QString *)
                           CONCAT44(in_stack_fffffffffffffc9c.i,
                                    CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)),
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffc94,
                                    CONCAT22(in_stack_fffffffffffffc92,
                                             CONCAT11(in_stack_fffffffffffffc91,
                                                      in_stack_fffffffffffffc90))));
      if (bVar1) {
        qgetenv(local_118);
        QByteArray::operator=
                  ((QByteArray *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,(QByteArray *)
                    CONCAT44(in_stack_fffffffffffffc8c,
                             CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
        QByteArray::~QByteArray((QByteArray *)0x36d65f);
      }
      else {
        qgetenv(local_130);
        QByteArray::operator=
                  ((QByteArray *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,(QByteArray *)
                    CONCAT44(in_stack_fffffffffffffc8c,
                             CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
        QByteArray::~QByteArray((QByteArray *)0x36d697);
      }
    }
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x36d6a8);
  if (bVar1) {
    qgetenv(local_148);
    QByteArray::operator=
              ((QByteArray *)
               CONCAT44(in_stack_fffffffffffffc94,
                        CONCAT22(in_stack_fffffffffffffc92,
                                 CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
               (QByteArray *)
               CONCAT44(in_stack_fffffffffffffc8c,
                        CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
    QByteArray::~QByteArray((QByteArray *)0x36d6e4);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x36d6f1);
  if (!bVar1) {
    local_150.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
    QString::fromLocal8Bit<void>
              ((QByteArray *)
               CONCAT44(in_stack_fffffffffffffc94,
                        CONCAT22(in_stack_fffffffffffffc92,
                                 CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))));
    QUrl::QUrl(&local_150,(QString *)local_168,TolerantMode);
    QString::~QString((QString *)0x36d741);
    local_180 = 0xaaaaaaaaaaaaaaaa;
    local_178 = 0xaaaaaaaaaaaaaaaa;
    local_170 = 0xaaaaaaaaaaaaaaaa;
    QUrl::scheme();
    local_190 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(in_stack_fffffffffffffc9c.i,
                                            CONCAT22(in_stack_fffffffffffffc9a,
                                                     in_stack_fffffffffffffc98)),
                           CONCAT44(in_stack_fffffffffffffc94,
                                    CONCAT22(in_stack_fffffffffffffc92,
                                             CONCAT11(in_stack_fffffffffffffc91,
                                                      in_stack_fffffffffffffc90))));
    bVar1 = ::operator==((QString *)
                         CONCAT44(in_stack_fffffffffffffc9c.i,
                                  CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)),
                         (QLatin1StringView *)
                         CONCAT44(in_stack_fffffffffffffc94,
                                  CONCAT22(in_stack_fffffffffffffc92,
                                           CONCAT11(in_stack_fffffffffffffc91,
                                                    in_stack_fffffffffffffc90))));
    if (bVar1) {
      local_198 = 0xaaaaaaaaaaaaaaaa;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffc94,
                          CONCAT22(in_stack_fffffffffffffc92,
                                   CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
                 in_stack_fffffffffffffc8c);
      QUrl::host((QFlags_conflict *)local_1b0);
      iVar3 = QUrl::port((int)&local_150);
      if (iVar3 == 0) {
        in_stack_fffffffffffffc9c.i = 0x438;
      }
      else {
        in_stack_fffffffffffffc9c.i = QUrl::port((int)&local_150);
      }
      in_stack_fffffffffffffc9a = (undefined2)in_stack_fffffffffffffc9c.i;
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffc94,
                          CONCAT22(in_stack_fffffffffffffc92,
                                   CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
                 in_stack_fffffffffffffc8c);
      QUrl::userName((QFlags_conflict *)local_1d0);
      QFlags<QUrl::ComponentFormattingOption>::QFlags
                ((QFlags<QUrl::ComponentFormattingOption> *)
                 CONCAT44(in_stack_fffffffffffffc94,
                          CONCAT22(in_stack_fffffffffffffc92,
                                   CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
                 in_stack_fffffffffffffc8c);
      QUrl::password((QFlags_conflict *)local_1f0);
      QNetworkProxy::QNetworkProxy
                ((QNetworkProxy *)this,type,
                 (QString *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (quint16)((ulong)pQVar4 >> 0x30),(QString *)in_RDI,
                 (QString *)
                 CONCAT44(in_stack_fffffffffffffc9c.i,
                          CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
      QString::~QString((QString *)0x36d8dd);
      QString::~QString((QString *)0x36d8ea);
      QString::~QString((QString *)0x36d8f7);
      QList<QNetworkProxy>::operator<<
                ((QList<QNetworkProxy> *)
                 CONCAT44(in_stack_fffffffffffffc94,
                          CONCAT22(in_stack_fffffffffffffc92,
                                   CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
                 (parameter_type)
                 CONCAT44(in_stack_fffffffffffffc8c,
                          CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x36d919);
    }
    else {
      local_208 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffc9c.i,
                                              CONCAT22(in_stack_fffffffffffffc9a,
                                                       in_stack_fffffffffffffc98)),
                             CONCAT44(in_stack_fffffffffffffc94,
                                      CONCAT22(in_stack_fffffffffffffc92,
                                               CONCAT11(in_stack_fffffffffffffc91,
                                                        in_stack_fffffffffffffc90))));
      bVar1 = ::operator==((QString *)
                           CONCAT44(in_stack_fffffffffffffc9c.i,
                                    CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)),
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffc94,
                                    CONCAT22(in_stack_fffffffffffffc92,
                                             CONCAT11(in_stack_fffffffffffffc91,
                                                      in_stack_fffffffffffffc90))));
      if (bVar1) {
        local_210 = 0xaaaaaaaaaaaaaaaa;
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,in_stack_fffffffffffffc8c);
        QUrl::host((QFlags_conflict *)local_228);
        iVar3 = QUrl::port((int)&local_150);
        if (iVar3 == 0) {
          in_stack_fffffffffffffc94 = 0x438;
        }
        else {
          in_stack_fffffffffffffc94 = QUrl::port((int)&local_150);
        }
        in_stack_fffffffffffffc92 = (undefined2)in_stack_fffffffffffffc94;
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,in_stack_fffffffffffffc8c);
        QUrl::userName((QFlags_conflict *)local_248);
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,in_stack_fffffffffffffc8c);
        QUrl::password((QFlags_conflict *)local_268);
        QNetworkProxy::QNetworkProxy
                  ((QNetworkProxy *)this,type,
                   (QString *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   (quint16)((ulong)pQVar4 >> 0x30),(QString *)in_RDI,
                   (QString *)
                   CONCAT44(in_stack_fffffffffffffc9c.i,
                            CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
        QString::~QString((QString *)0x36da78);
        QString::~QString((QString *)0x36da85);
        QString::~QString((QString *)0x36da92);
        QFlags<QNetworkProxy::Capability>::QFlags
                  ((QFlags<QNetworkProxy::Capability> *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,in_stack_fffffffffffffc8c);
        QNetworkProxy::setCapabilities
                  ((QNetworkProxy *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,(Capabilities)in_stack_fffffffffffffc9c.i);
        QList<QNetworkProxy>::operator<<
                  ((QList<QNetworkProxy> *)
                   CONCAT44(in_stack_fffffffffffffc94,
                            CONCAT22(in_stack_fffffffffffffc92,
                                     CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)))
                   ,(parameter_type)
                    CONCAT44(in_stack_fffffffffffffc8c,
                             CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
        QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x36dada);
      }
      else {
        bVar1 = QString::isEmpty((QString *)0x36daec);
        if (bVar1) {
LAB_0036db35:
          QVar2 = QNetworkProxyQuery::queryType
                            ((QNetworkProxyQuery *)
                             CONCAT44(in_stack_fffffffffffffc94,
                                      CONCAT22(in_stack_fffffffffffffc92,
                                               CONCAT11(in_stack_fffffffffffffc91,
                                                        in_stack_fffffffffffffc90))));
          in_stack_fffffffffffffc91 = false;
          if (QVar2 != UdpSocket) {
            QVar2 = QNetworkProxyQuery::queryType
                              ((QNetworkProxyQuery *)
                               CONCAT44(in_stack_fffffffffffffc94,
                                        CONCAT22(in_stack_fffffffffffffc92,
                                                 (ushort)in_stack_fffffffffffffc90)));
            in_stack_fffffffffffffc91 = QVar2 != TcpServer;
          }
        }
        else {
          local_280 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT44(in_stack_fffffffffffffc9c.i,
                                                  CONCAT22(in_stack_fffffffffffffc9a,
                                                           in_stack_fffffffffffffc98)),
                                 CONCAT44(in_stack_fffffffffffffc94,
                                          CONCAT22(in_stack_fffffffffffffc92,
                                                   CONCAT11(in_stack_fffffffffffffc91,
                                                            in_stack_fffffffffffffc90))));
          bVar1 = ::operator==((QString *)
                               CONCAT44(in_stack_fffffffffffffc9c.i,
                                        CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98
                                                )),
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffffc94,
                                        CONCAT22(in_stack_fffffffffffffc92,
                                                 CONCAT11(in_stack_fffffffffffffc91,
                                                          in_stack_fffffffffffffc90))));
          in_stack_fffffffffffffc91 = false;
          if (bVar1) goto LAB_0036db35;
        }
        if ((bool)in_stack_fffffffffffffc91 != false) {
          local_288 = 0xaaaaaaaaaaaaaaaa;
          QFlags<QUrl::ComponentFormattingOption>::QFlags
                    ((QFlags<QUrl::ComponentFormattingOption> *)
                     CONCAT44(in_stack_fffffffffffffc94,
                              CONCAT22(in_stack_fffffffffffffc92,
                                       CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)
                                      )),in_stack_fffffffffffffc8c);
          QUrl::host((QFlags_conflict *)local_2a0);
          iVar3 = QUrl::port((int)&local_150);
          if (iVar3 == 0) {
            in_stack_fffffffffffffc8c = 0x1f90;
          }
          else {
            in_stack_fffffffffffffc8c = QUrl::port((int)&local_150);
          }
          in_stack_fffffffffffffc8a = (undefined2)in_stack_fffffffffffffc8c;
          QFlags<QUrl::ComponentFormattingOption>::QFlags
                    ((QFlags<QUrl::ComponentFormattingOption> *)
                     CONCAT44(in_stack_fffffffffffffc94,
                              CONCAT22(in_stack_fffffffffffffc92,
                                       CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)
                                      )),in_stack_fffffffffffffc8c);
          QUrl::userName((QFlags_conflict *)local_2c0);
          QFlags<QUrl::ComponentFormattingOption>::QFlags
                    ((QFlags<QUrl::ComponentFormattingOption> *)
                     CONCAT44(in_stack_fffffffffffffc94,
                              CONCAT22(in_stack_fffffffffffffc92,
                                       CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)
                                      )),in_stack_fffffffffffffc8c);
          QUrl::password((QFlags_conflict *)local_2e0);
          QNetworkProxy::QNetworkProxy
                    ((QNetworkProxy *)this,type,
                     (QString *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                     (quint16)((ulong)pQVar4 >> 0x30),(QString *)in_RDI,
                     (QString *)
                     CONCAT44(in_stack_fffffffffffffc9c.i,
                              CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
          QString::~QString((QString *)0x36dc88);
          QString::~QString((QString *)0x36dc95);
          QString::~QString((QString *)0x36dca2);
          QList<QNetworkProxy>::operator<<
                    ((QList<QNetworkProxy> *)
                     CONCAT44(in_stack_fffffffffffffc94,
                              CONCAT22(in_stack_fffffffffffffc92,
                                       CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90)
                                      )),
                     (parameter_type)
                     CONCAT44(in_stack_fffffffffffffc8c,
                              CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
          QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x36dcc4);
        }
      }
    }
    QString::~QString((QString *)0x36dcd5);
    QUrl::~QUrl(&local_150);
  }
  bVar1 = QList<QNetworkProxy>::isEmpty((QList<QNetworkProxy> *)0x36dcef);
  if (bVar1) {
    QString::QString((QString *)0x36dd02);
    QString::QString((QString *)0x36dd0c);
    QString::QString((QString *)0x36dd16);
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)this,type,
               (QString *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (quint16)((ulong)pQVar4 >> 0x30),(QString *)in_RDI,
               (QString *)
               CONCAT44(in_stack_fffffffffffffc9c.i,
                        CONCAT22(in_stack_fffffffffffffc9a,in_stack_fffffffffffffc98)));
    QList<QNetworkProxy>::operator<<
              ((QList<QNetworkProxy> *)
               CONCAT44(in_stack_fffffffffffffc94,
                        CONCAT22(in_stack_fffffffffffffc92,
                                 CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
               (rvalue_ref)
               CONCAT44(in_stack_fffffffffffffc8c,
                        CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x36dd5b);
    QString::~QString((QString *)0x36dd65);
    QString::~QString((QString *)0x36dd6f);
    QString::~QString((QString *)0x36dd79);
  }
  QList<QNetworkProxy>::QList
            ((QList<QNetworkProxy> *)
             CONCAT44(in_stack_fffffffffffffc94,
                      CONCAT22(in_stack_fffffffffffffc92,
                               CONCAT11(in_stack_fffffffffffffc91,in_stack_fffffffffffffc90))),
             (QList<QNetworkProxy> *)
             CONCAT44(in_stack_fffffffffffffc8c,
                      CONCAT22(in_stack_fffffffffffffc8a,in_stack_fffffffffffffc88)));
  QByteArray::~QByteArray((QByteArray *)0x36dda0);
  QString::~QString((QString *)0x36ddad);
LAB_0036ddad:
  QList<QNetworkProxy>::~QList((QList<QNetworkProxy> *)0x36ddba);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QList<QNetworkProxy> QNetworkProxyFactory::systemProxyForQuery(const QNetworkProxyQuery &query)
{
    QList<QNetworkProxy> proxyList;

    if (ignoreProxyFor(query))
        return proxyList << QNetworkProxy::NoProxy;

    // No need to care about casing here, QUrl lowercases values already
    const QString queryProtocol = query.protocolTag();
    QByteArray proxy_env;

    if (queryProtocol == "http"_L1)
        proxy_env = qgetenv("http_proxy");
    else if (queryProtocol == "https"_L1)
        proxy_env = qgetenv("https_proxy");
    else if (queryProtocol == "ftp"_L1)
        proxy_env = qgetenv("ftp_proxy");
    else
        proxy_env = qgetenv("all_proxy");

    // Fallback to http_proxy is no protocol specific proxy was found
    if (proxy_env.isEmpty())
        proxy_env = qgetenv("http_proxy");

    if (!proxy_env.isEmpty()) {
        QUrl url = QUrl(QString::fromLocal8Bit(proxy_env));
        const QString scheme = url.scheme();
        if (scheme == "socks5"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxyList << proxy;
        } else if (scheme == "socks5h"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxy.setCapabilities(QNetworkProxy::HostNameLookupCapability);
            proxyList << proxy;
        } else if ((scheme.isEmpty() || scheme == "http"_L1)
                  && query.queryType() != QNetworkProxyQuery::UdpSocket
                  && query.queryType() != QNetworkProxyQuery::TcpServer) {
            QNetworkProxy proxy(QNetworkProxy::HttpProxy, url.host(),
                    url.port() ? url.port() : 8080, url.userName(), url.password());
            proxyList << proxy;
        }
    }
    if (proxyList.isEmpty())
        proxyList << QNetworkProxy::NoProxy;

    return proxyList;
}